

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_bson_array(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong __n;
  void *pvVar8;
  void *pvVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  bson_t *bson;
  char *__buf;
  char *__n_00;
  char *pcVar10;
  char *pcVar11;
  char *extraout_RAX_02;
  dirent *pdVar12;
  size_t sVar13;
  size_t sVar14;
  DIR *__dirp;
  FILE *__stream;
  long lVar15;
  char *pcVar16;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar17;
  char *pcVar18;
  DIR *__s;
  DIR *__name;
  char *pcVar19;
  DIR *paths;
  DIR *__filename;
  undefined8 uVar20;
  undefined1 *unaff_R13;
  char *pcVar21;
  char *pcVar22;
  void *unaff_R15;
  char *__n_01;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  bson_t ochild;
  undefined1 auStack_7088 [8];
  undefined1 auStack_7080 [504];
  ulong uStack_6e88;
  DIR *pDStack_6e80;
  dirent *pdStack_6e78;
  DIR *pDStack_6e70;
  DIR *pDStack_6e68;
  stat sStack_6e60;
  char acStack_6dd0 [512];
  size_t sStack_6bd0;
  dirent *pdStack_6bc8;
  DIR *pDStack_6bc0;
  char *pcStack_6bb8;
  code *pcStack_6bb0;
  char *pcStack_6ba8;
  ulong uStack_6ba0;
  char *pcStack_6b98;
  DIR *pDStack_6b90;
  code *pcStack_6b88;
  undefined8 uStack_6b50;
  undefined1 *puStack_6b48;
  undefined1 *puStack_6b40;
  undefined1 auStack_6b30 [8];
  char *pcStack_6b28;
  char *pcStack_6b18;
  char *pcStack_6b10;
  undefined8 uStack_6b08;
  undefined8 uStack_6af0;
  DIR aDStack_6a80 [25944];
  char *pcStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  code *apcStack_508 [2];
  undefined1 auStack_4f8 [116];
  uint uStack_484;
  char acStack_480 [256];
  undefined8 uStack_380;
  char *pcStack_378;
  char *pcStack_370;
  char *pcStack_368;
  char *pcStack_360;
  char *pcStack_358;
  char *pcStack_350;
  undefined8 uStack_348;
  code *pcStack_340;
  char *pcStack_338;
  undefined8 uStack_330;
  char *pcStack_328;
  char *pcStack_320;
  char *pcStack_318;
  char *pcStack_310;
  code *pcStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  char *pcStack_2f0;
  char *pcStack_2e8;
  char *pcStack_2e0;
  undefined8 uStack_2d8;
  bson_t *pbStack_2d0;
  char *pcStack_2c8;
  code *pcStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  char *pcStack_288;
  char *pcStack_280;
  code *pcStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined1 *puStack_258;
  char *pcStack_250;
  char *pcStack_248;
  code *pcStack_240;
  undefined8 uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  undefined1 *puStack_220;
  char *pcStack_218;
  void *pvStack_210;
  code *pcStack_208;
  uint local_184;
  undefined1 local_180 [4];
  uint local_17c;
  
  pcStack_208 = (code *)0x13d484;
  uVar6 = bcon_new(0,"0","baz",0);
  pcStack_208 = (code *)0x13d48c;
  uVar7 = bson_bcon_magic();
  pcVar22 = "foo";
  pcStack_208 = (code *)0x13d4ad;
  __n = bcon_new(0,"foo",uVar7,3,uVar6,0);
  pcStack_208 = (code *)0x13d4b5;
  uVar7 = bson_bcone_magic();
  pcStack_208 = (code *)0x13d4d5;
  cVar1 = bcon_extract(__n,"foo",uVar7,3,local_180,0);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_208 = (code *)0x13d4ed;
    unaff_R15 = (void *)bson_get_data(local_180);
    pcStack_208 = (code *)0x13d4f8;
    pcVar22 = (char *)bson_get_data(uVar6);
    if (*(uint *)(uVar6 + 4) == local_17c) {
      pcStack_208 = (code *)0x13d50c;
      pvVar8 = (void *)bson_get_data(uVar6);
      pcStack_208 = (code *)0x13d51c;
      pvVar9 = (void *)bson_get_data(local_180);
      pcStack_208 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar8,pvVar9,(ulong)*(uint *)(uVar6 + 4));
      if (iVar2 == 0) {
        pcStack_208 = (code *)0x13d53b;
        bson_destroy(local_180);
        pcStack_208 = (code *)0x13d543;
        bson_destroy(uVar6);
        pcStack_208 = (code *)0x13d54b;
        bson_destroy(__n);
        return;
      }
    }
    unaff_R13 = local_180;
    pcStack_208 = (code *)0x13d56c;
    __n = bson_as_canonical_extended_json(unaff_R13);
    pcStack_208 = (code *)0x13d579;
    uVar7 = bson_as_canonical_extended_json(uVar6);
    uVar3 = *(uint *)(uVar6 + 4);
    if (local_17c != 0) {
      uVar17 = 0;
      do {
        if (uVar3 == (uint)uVar17) break;
        if (*(char *)((long)unaff_R15 + uVar17) != pcVar22[uVar17]) goto LAB_0013d649;
        uVar17 = uVar17 + 1;
      } while (local_17c != (uint)uVar17);
    }
    uVar4 = local_17c;
    if (local_17c < uVar3) {
      uVar4 = uVar3;
    }
    uVar17 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_208 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,__n,uVar7);
      pcStack_208 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (ulong)uVar3;
      pcStack_208 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      local_184 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      __n = (ulong)local_17c;
      pcStack_208 = (code *)0x13d622;
      uVar17 = write(uVar3,unaff_R15,__n);
      if (uVar17 != __n) goto LAB_0013d65f;
      uVar6 = (ulong)*(uint *)(uVar6 + 4);
      pcStack_208 = (code *)0x13d638;
      uVar17 = write(uVar4,pcVar22,uVar6);
      if (uVar17 != uVar6) goto LAB_0013d664;
      uVar17 = (ulong)uVar4;
      pcStack_208 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar7 = extraout_RAX;
LAB_0013d649:
      uVar17 = uVar17 & 0xffffffff;
    }
  }
  pcStack_208 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_208 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_208 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_208 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_240 = (code *)0x13d679;
  uStack_238 = extraout_RAX_00;
  uStack_230 = uVar6;
  uStack_228 = __n;
  puStack_220 = unaff_R13;
  pcStack_218 = pcVar22;
  pvStack_210 = unaff_R15;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  uStack_268 = bson_bcon_magic();
  pcStack_248 = (char *)0x0;
  pcStack_250 = "]";
  puStack_258 = (undefined1 *)0x2;
  uStack_260 = 0xf;
  uStack_270 = 0x13d6c1;
  uVar7 = bcon_new(0,"foo","[",uStack_268,0xf,1);
  pcStack_240 = (code *)0x13d6cd;
  uStack_268 = bson_bcone_magic();
  pcStack_248 = (char *)0x0;
  pcStack_250 = "]";
  uStack_260 = 0xf;
  uStack_270 = 0x13d6fc;
  puStack_258 = (undefined1 *)&uStack_238;
  cVar1 = bcon_extract(uVar7,"foo","[",uStack_268,0xf,(long)&uStack_238 + 4);
  if (cVar1 == '\0') {
    pcStack_240 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_240 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_238._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_238 == 2) {
      pcStack_240 = (code *)0x13d719;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_240 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_240 = (code *)0x14a05b;
  pcStack_248 = "[";
  pcStack_250 = "foo";
  puStack_258 = (undefined1 *)0x0;
  uStack_260 = 0xf;
  pcStack_278 = (code *)0x13d747;
  uStack_270 = extraout_RAX_01;
  uStack_268 = uVar7;
  pcStack_2a0 = (char *)bson_bcon_magic();
  pcStack_280 = (char *)0x0;
  pcStack_288 = "}";
  pcStack_290 = (char *)0x1;
  pcStack_298 = (char *)0xf;
  uStack_2a8 = "a";
  uStack_2b0 = 2;
  uStack_2b8 = 0x13d79a;
  uVar7 = bcon_new(0,"foo","{","b",pcStack_2a0,0xf);
  pcStack_278 = (code *)0x13d7a6;
  pcStack_2a0 = (char *)bson_bcone_magic();
  uStack_2b0 = (long)&uStack_270 + 4;
  pcStack_280 = (char *)0x0;
  pcStack_288 = "}";
  pcStack_298 = (char *)0xf;
  uStack_2a8 = "b";
  uStack_2b8 = 0x13d7e9;
  pcStack_290 = (char *)&uStack_270;
  cVar1 = bcon_extract(uVar7,"foo","{","a",pcStack_2a0,0xf);
  if (cVar1 == '\0') {
    pcStack_278 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_278 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_270._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_270 == 2) {
      pcStack_278 = (code *)0x13d806;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_278 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_278 = (code *)0x0;
  pcStack_280 = "a";
  pcStack_290 = "{";
  pcStack_298 = "foo";
  pcStack_2a0 = "}";
  pcStack_2c0 = (code *)0x13d837;
  pcStack_288 = (char *)uVar7;
  uStack_2f8 = (undefined8 *)bson_bcon_magic();
  pcStack_2c0 = (code *)0x0;
  pcStack_2c8 = (char *)0x3;
  pbStack_2d0 = (bson_t *)0xf;
  pcStack_2e0 = "c";
  pcStack_2e8 = (char *)0x2;
  pcStack_2f0 = (char *)0xf;
  uStack_300 = 0x13d879;
  uStack_2d8 = uStack_2f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_2f8,0xf,1,"b");
  pcStack_2c0 = (code *)0x13d885;
  pcStack_308 = (code *)bson_bcone_magic();
  pbStack_2d0 = (bson_t *)((long)&uStack_2b0 + 4);
  uStack_2f8 = &uStack_2a8;
  pcStack_2c8 = (char *)0x0;
  uStack_2d8 = 0xf;
  pcStack_2e8 = "c";
  pcStack_2f0 = (char *)0x0;
  uStack_300 = 0xf;
  pcStack_310 = "b";
  pcStack_318 = (char *)0x0;
  pcStack_320 = (char *)0x13d8d1;
  pcStack_2e0 = (char *)pcStack_308;
  test_extract_ctx_helper(bson,3,"a",pcStack_308,0xf,(long)&uStack_2a8 + 4);
  if (uStack_2a8._4_4_ == 1) {
    if ((int)uStack_2a8 != 2) goto LAB_0013d906;
    if (uStack_2b0._4_4_ == 3) {
      pcStack_2c0 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_2c0 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_2c0 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_2c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_2c0 = (code *)0xf;
  pcStack_2c8 = "a";
  uStack_2d8 = 0;
  pcStack_2e8 = "c";
  pcStack_308 = (code *)0x13d923;
  pcStack_2e0 = (char *)((long)&uStack_2a8 + 4);
  pbStack_2d0 = bson;
  uStack_330 = bson_bcon_magic();
  pcStack_310 = (char *)0x0;
  pcStack_318 = "}";
  pcStack_320 = (char *)0xa;
  pcStack_328 = (char *)0xf;
  pcStack_338 = (char *)0x13d978;
  uVar7 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_308 = (code *)0x13d984;
  uStack_330 = bson_bcone_magic();
  pcStack_320 = (char *)((long)&uStack_2f8 + 4);
  pcStack_310 = (char *)0x0;
  pcStack_318 = "}";
  pcStack_328 = (char *)0xf;
  pcStack_338 = "bar";
  pcStack_340 = (code *)0x141970;
  uStack_348 = 0x13d9c0;
  cVar1 = bcon_extract(uVar7,"hello",uStack_330,0,&pcStack_2f0,"foo");
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_308 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_308 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_2f0);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_2f8._4_4_ == 10) {
      pcStack_308 = (code *)0x13d9ec;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_308 = test_skip;
  test_nested_cold_3();
  pcStack_308 = (code *)0x14ad57;
  pcStack_310 = "bar";
  pcStack_318 = (char *)0x0;
  pcStack_320 = "hello";
  pcStack_328 = "foo";
  pcStack_340 = (code *)0x13da1a;
  uStack_330 = uVar7;
  pcStack_368 = (char *)bson_bcon_magic();
  uStack_348 = 0;
  pcStack_350 = "}";
  pcStack_358 = (char *)0xa;
  pcStack_360 = (char *)0xf;
  pcStack_370 = (char *)0x13da6d;
  uVar7 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_340 = (code *)0x13da79;
  pcVar22 = (char *)bson_bcone_magic();
  pcVar21 = "}";
  uStack_348 = 0;
  pcStack_350 = "}";
  pcStack_358 = (char *)0x10;
  pcStack_360 = (char *)0x1c;
  pcStack_370 = "bar";
  pcStack_378 = "{";
  uStack_380 = 0x13dab5;
  pcStack_368 = pcVar22;
  cVar1 = bcon_extract(uVar7,"hello",pcVar22,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_340 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_348 = 0;
    pcStack_350 = "}";
    pcStack_358 = (char *)0x12;
    pcStack_360 = (char *)0x1c;
    pcStack_370 = "bar";
    pcStack_378 = "{";
    uStack_380 = 0x13daf4;
    pcStack_368 = pcVar22;
    cVar1 = bcon_extract(uVar7,"hello",pcVar22,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_340 = test_iter;
  test_skip_cold_2();
  pcStack_340 = (code *)0x14e902;
  pcStack_350 = "bar";
  pcStack_358 = "}";
  pcStack_368 = "{";
  apcStack_508[0] = (code *)0x13db39;
  pcStack_360 = pcVar22;
  uStack_348 = uVar7;
  __buf = (char *)bson_bcon_magic();
  __n_01 = "foo";
  apcStack_508[0] = (code *)0x13db60;
  __n_00 = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_508[0] = (code *)0x13db68;
  uVar7 = bson_bcone_magic();
  pcVar10 = acStack_480;
  pcVar18 = "foo";
  pcVar16 = (char *)0x1d;
  uVar20 = 0;
  apcStack_508[0] = (code *)0x13db88;
  pcVar19 = __n_00;
  cVar1 = bcon_extract(__n_00,"foo",uVar7);
  if (cVar1 == '\0') {
    apcStack_508[0] = (code *)0x13dd34;
    uVar7 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_508[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar19 = acStack_480;
    apcStack_508[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar7 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar19 = acStack_480;
    apcStack_508[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar7 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar20 = 0;
      apcStack_508[0] = (code *)0x13dbdf;
      __n_01 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_480);
      apcStack_508[0] = (code *)0x13dbea;
      pcVar22 = (char *)bson_get_data(__n_01);
      apcStack_508[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n_00);
      if (*(int *)(__n_00 + 4) == *(int *)(__n_01 + 4)) {
        apcStack_508[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n_00);
        apcStack_508[0] = (code *)0x13dc14;
        pvVar9 = (void *)bson_get_data(__n_01);
        apcStack_508[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,pvVar9,(ulong)*(uint *)(__n_00 + 4));
        if (iVar2 == 0) {
          apcStack_508[0] = (code *)0x13dc2e;
          bson_destroy(__n_00);
          apcStack_508[0] = (code *)0x13dc36;
          bson_destroy(__n_01);
          return;
        }
      }
      apcStack_508[0] = (code *)0x13dc4f;
      pcVar21 = (char *)bson_as_canonical_extended_json(__n_01);
      apcStack_508[0] = (code *)0x13dc5c;
      pcVar10 = (char *)bson_as_canonical_extended_json(__n_00);
      uVar3 = *(uint *)(__n_01 + 4);
      uVar4 = *(uint *)(__n_00 + 4);
      uVar7 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          if (uVar4 == (uint)uVar6) break;
          if (pcVar22[uVar6] != __buf[uVar6]) goto LAB_0013dd28;
          uVar6 = uVar6 + 1;
        } while (uVar3 != (uint)uVar6);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar6 = (ulong)(uVar3 - 1);
      pcVar16 = pcVar21;
      while( true ) {
        apcStack_508[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar6);
        apcStack_508[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar21 = (char *)(ulong)uVar3;
        pcVar19 = "failure.expected.bson";
        pcVar18 = (char *)0x42;
        apcStack_508[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_484 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar21 = (char *)(ulong)uVar4;
        __n_01 = (char *)(ulong)*(uint *)(__n_01 + 4);
        pcVar19 = (char *)(ulong)uVar3;
        apcStack_508[0] = (code *)0x13dd01;
        pcVar18 = pcVar22;
        pcVar11 = (char *)write(uVar3,pcVar22,(size_t)__n_01);
        if (pcVar11 != __n_01) goto LAB_0013dd48;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        apcStack_508[0] = (code *)0x13dd17;
        pcVar18 = __buf;
        pcVar19 = pcVar21;
        pcVar11 = (char *)write(uVar4,__buf,(size_t)__n_00);
        if (pcVar11 != __n_00) goto LAB_0013dd4d;
        uVar6 = (ulong)uVar4;
        apcStack_508[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar10 = extraout_RAX_02;
LAB_0013dd28:
        uVar6 = uVar6 & 0xffffffff;
        pcVar16 = pcVar21;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_508[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_508[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_508[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_508[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_508[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6b40 = auStack_6b30;
  if (extraout_AL != '\0') {
    uStack_6af0 = uVar7;
  }
  pcStack_6b88 = (code *)0x13ddd5;
  pcStack_6b28 = pcVar18;
  pcStack_6b18 = pcVar16;
  pcStack_6b10 = pcVar10;
  uStack_6b08 = uVar20;
  pcStack_528 = __n_00;
  pcStack_520 = pcVar22;
  pcStack_518 = __buf;
  pcStack_510 = __n_01;
  apcStack_508[0] = (code *)&pcStack_340;
  bcon_extract_ctx_init(aDStack_6a80);
  puStack_6b48 = auStack_4f8;
  uStack_6b50 = 0x3000000010;
  uVar7 = 0x10;
  if (0 < (int)(uint)pcStack_6b28) {
    uVar3 = (uint)pcStack_6b28;
    do {
      pcStack_6b88 = (code *)0x13de41;
      __s = aDStack_6a80;
      pcVar22 = pcVar19;
      cVar1 = bcon_extract_ctx_va(pcVar19,aDStack_6a80,&uStack_6b50);
      iVar2 = (int)uVar7;
      if (cVar1 == '\0') {
        pcStack_6b88 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_6bb0 = (code *)0x13de73;
        __name = __s;
        pcStack_6ba8 = pcVar19;
        uStack_6ba0 = (ulong)uVar3;
        pcStack_6b98 = pcVar21;
        pDStack_6b90 = aDStack_6a80;
        pcStack_6b88 = (code *)&uStack_6b50;
        pdVar12 = (dirent *)strlen(pcVar22);
        pcStack_6bb0 = (code *)0x13de7e;
        paths = __s;
        sVar13 = strlen((char *)__s);
        if ((int)sVar13 + (int)pdVar12 < 499) {
          pcStack_6bb0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_6bb0 = (code *)0x13dea8;
          strncat(__dest,pcVar22,(long)(int)pdVar12);
          pcStack_6bb0 = (code *)0x13deb0;
          sVar14 = strlen(__dest);
          (__dest + sVar14)[0] = '/';
          (__dest + sVar14)[1] = '\0';
          pcStack_6bb0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar13);
          pcVar22 = __dest;
          do {
            if (*pcVar22 == '\\') {
              *pcVar22 = '/';
            }
            else if (*pcVar22 == '\0') {
              return;
            }
            pcVar22 = pcVar22 + 1;
          } while( true );
        }
        pcStack_6bb0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar6 = (ulong)extraout_EDX;
        pDStack_6e68 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_6bd0 = sVar13;
        pdStack_6bc8 = pdVar12;
        pDStack_6bc0 = __s;
        pcStack_6bb8 = pcVar22;
        pcStack_6bb0 = (code *)apcStack_508;
        __dirp = opendir((char *)__name);
        pDStack_6e70 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_6e68 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar12 = readdir(__dirp);
        do {
          if (pdVar12 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_6e68 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar6;
          if (iVar2 <= paths_index) {
            pDStack_6e68 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_6e70 = __dirp;
LAB_0013e018:
            pDStack_6e68 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_6e88 = uVar6;
            pDStack_6e80 = paths;
            pdStack_6e78 = pdVar12;
            pDStack_6e68 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar13 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar13) {
                pvVar8 = (void *)bson_malloc0(sVar13);
                sVar14 = fread(pvVar8,1,sVar13,__stream);
                if (sVar14 != sVar13) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar15 = bson_new_from_json(pvVar8,sVar13,auStack_7088);
                  if (lVar15 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7080);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar12->d_name[0] == '.' &&
                 (((pdVar12->d_name[1] == '.' && (pdVar12->d_name[2] == '\0')) ||
                  (pdVar12->d_name[1] == '\0'))))) {
            pDStack_6e68 = (DIR *)0x13df58;
            pdVar12 = readdir(__dirp);
            if (pdVar12 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar22 = pdVar12->d_name;
          pDStack_6e68 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar22,acStack_6dd0);
          pDStack_6e68 = (DIR *)0x13df87;
          iVar5 = stat(pcVar22,&sStack_6e60);
          if ((iVar5 == 0) && ((sStack_6e60.st_mode & 0xf000) == 0x4000)) {
            pDStack_6e68 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_6dd0,paths_index,iVar2);
            uVar6 = (ulong)uVar3;
          }
          else {
            pDStack_6e68 = (DIR *)0x13dfc4;
            pcVar21 = strstr(pcVar22,".json");
            if (pcVar21 != (char *)0x0) {
              uVar6 = (ulong)(paths_index + 1);
              pDStack_6e68 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar22,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_6e68 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar12 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_bson_array (void)
{
   bson_t ochild;
   bson_t *child = BCON_NEW ("0", "baz");
   bson_t *bcon = BCON_NEW ("foo", BCON_ARRAY (child));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_ARRAY (ochild)));

   bson_eq_bson (&ochild, child);

   bson_destroy (&ochild);
   bson_destroy (child);
   bson_destroy (bcon);
}